

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O2

double rapidjson::internal::StrtodNormalPrecision(double d,int p)

{
  double dVar1;
  
  if (-0x135 < p) {
    dVar1 = 0.0;
    if (-0x135 < p) {
      if (p < 0) {
        dVar1 = d / *(double *)(Pow10(int)::e + (ulong)(uint)-p * 8);
      }
      else {
        dVar1 = d * *(double *)(Pow10(int)::e + (ulong)(uint)p * 8);
      }
    }
    return dVar1;
  }
  dVar1 = FastPath(d / 1e+308,p + 0x134);
  return dVar1;
}

Assistant:

inline double StrtodNormalPrecision(double d, int p) {
    if (p < -308) {
        // Prevent expSum < -308, making Pow10(p) = 0
        d = FastPath(d, -308);
        d = FastPath(d, p + 308);
    }
    else
        d = FastPath(d, p);
    return d;
}